

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::LoopDependenceAnalysis::SymbolicStrongSIVTest
          (LoopDependenceAnalysis *this,SENode *source,SENode *destination,SENode *coefficient,
          DistanceEntry *distance_entry)

{
  bool bVar1;
  SENode *pSVar2;
  Loop *loop;
  Directions DVar3;
  pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> subscript_pair;
  string local_a0;
  string local_80;
  string local_60;
  pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> local_40;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"Performing SymbolicStrongSIVTest.","");
  PrintDebug(this,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  pSVar2 = ScalarEvolutionAnalysis::CreateSubtraction(&this->scalar_evolution_,source,destination);
  pSVar2 = ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,pSVar2);
  local_40.first = source;
  local_40.second = destination;
  loop = GetLoopForSubscriptPair(this,&local_40);
  bVar1 = IsProvablyOutsideOfLoopBounds(this,loop,pSVar2,coefficient);
  if (bVar1) {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"SymbolicStrongSIVTest proved independence through loop bounds.",
               "");
    PrintDebug(this,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    distance_entry->dependence_information = DIRECTION;
    DVar3 = NONE;
  }
  else {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,
               "SymbolicStrongSIVTest was unable to determine any dependence information.","");
    PrintDebug(this,&local_a0);
    DVar3 = ALL;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  distance_entry->direction = DVar3;
  return bVar1;
}

Assistant:

bool LoopDependenceAnalysis::SymbolicStrongSIVTest(
    SENode* source, SENode* destination, SENode* coefficient,
    DistanceEntry* distance_entry) {
  PrintDebug("Performing SymbolicStrongSIVTest.");
  SENode* source_destination_delta = scalar_evolution_.SimplifyExpression(
      scalar_evolution_.CreateSubtraction(source, destination));
  // By cancelling out the induction variables by subtracting the source and
  // destination we can produce an expression of symbolics and constants. This
  // expression can be compared to the loop bounds to find if the offset is
  // outwith the bounds.
  std::pair<SENode*, SENode*> subscript_pair =
      std::make_pair(source, destination);
  const Loop* subscript_loop = GetLoopForSubscriptPair(subscript_pair);
  if (IsProvablyOutsideOfLoopBounds(subscript_loop, source_destination_delta,
                                    coefficient)) {
    PrintDebug(
        "SymbolicStrongSIVTest proved independence through loop bounds.");
    distance_entry->dependence_information =
        DistanceEntry::DependenceInformation::DIRECTION;
    distance_entry->direction = DistanceEntry::Directions::NONE;
    return true;
  }
  // We were unable to prove independence or discern any additional information.
  // Must assume <=> direction.
  PrintDebug(
      "SymbolicStrongSIVTest was unable to determine any dependence "
      "information.");
  distance_entry->direction = DistanceEntry::Directions::ALL;
  return false;
}